

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.c
# Opt level: O0

rt_function_error_t exec_celu_generic(rt_function_t *f)

{
  int iVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong extraout_RDX;
  float __x;
  float value;
  float x;
  int s1;
  int s0;
  int j;
  int i;
  celu_private_t *p;
  celu_local_context_t *c;
  rt_function_t *f_local;
  
  puVar2 = *f->local_context;
  x = 1.4013e-45;
  for (s0 = *(int *)((long)f->local_context + 0xc); s0 < *(int *)(puVar2 + 6); s0 = s0 + 1) {
    x = (float)(*(int *)(puVar2[7] + (long)s0 * 4) * (int)x);
  }
  iVar1 = *(int *)(puVar2 + 2);
  uVar3 = (long)iVar1 % (long)(int)x & 0xffffffff;
  for (s0 = 0; s0 < iVar1 / (int)x; s0 = s0 + 1) {
    for (s1 = 0; s1 < (int)x; s1 = s1 + 1) {
      __x = (float)(*(code *)puVar2[1])(*puVar2,s0 * (int)x + s1,uVar3);
      if (__x <= 0.0) {
        expf(__x);
      }
      (*(code *)puVar2[4])(puVar2[3],s0 * (int)x * 2 + s1);
      if (0.0 <= __x) {
        expf(-__x);
      }
      (*(code *)puVar2[4])(puVar2[3],s0 * (int)x * 2 + (int)x + s1);
      uVar3 = extraout_RDX;
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_celu_generic(rt_function_t *f) {
  celu_local_context_t *c = (celu_local_context_t *)(f->local_context);
  celu_private_t *p = (celu_private_t *)(c->data);
  int i, j, s0 = 1, s1;

  for (i = c->axis; i < p->in_shape.size; ++i) {
    s0 *= p->in_shape.data[i];
  }
  s1 = p->input_size / s0;

  for (i = 0; i < s1; ++i) {
    for (j = 0; j < s0; ++j) {
      float x = p->get_input(p->input, i * s0 + j);
      float value = x > 0.0f ? x : c->alpha * (expf(x) - 1.0f);
      p->set_output(p->output, i * s0 * 2 + j, value);
      value = x < 0.0f ? -x : c->alpha * (expf(-x) - 1.0f);
      p->set_output(p->output, i * s0 * 2 + s0 + j, value);
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}